

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::FilterVector
          (ColumnData *this,ColumnScanState *state,Vector *result,idx_t target_count,
          SelectionVector *sel,idx_t *sel_count,TableFilter *filter,TableFilterState *filter_state)

{
  InternalException *this_00;
  idx_t iVar1;
  string local_50;
  
  BeginScanVectorInternal(this,state);
  if (target_count <=
      ((state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
       super___atomic_base<unsigned_long>._M_i +
      (state->current->super_SegmentBase<duckdb::ColumnSegment>).start) - state->row_index) {
    ColumnSegment::Filter
              (state->current,state,target_count,result,sel,sel_count,filter,filter_state);
    iVar1 = target_count + state->row_index;
    state->row_index = iVar1;
    state->internal_index = iVar1;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "ColumnData::Filter should be able to fetch everything from one segment","");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnData::FilterVector(ColumnScanState &state, Vector &result, idx_t target_count, SelectionVector &sel,
                              idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	BeginScanVectorInternal(state);
	if (state.current->start + state.current->count - state.row_index < target_count) {
		throw InternalException("ColumnData::Filter should be able to fetch everything from one segment");
	}
	state.current->Filter(state, target_count, result, sel, sel_count, filter, filter_state);
	state.row_index += target_count;
	state.internal_index = state.row_index;
}